

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzrot::VariablesQbSetSpeed(ChNodeFEAxyzrot *this,double step)

{
  undefined1 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double oos;
  double dVar9;
  ChVector<double> v;
  double local_98;
  double dStack_90;
  double local_88;
  ChVectorRef *local_80;
  undefined8 local_78;
  long local_68;
  double local_60;
  long local_58;
  ChVector<double> local_48;
  
  dVar2 = *(double *)&this->field_0xa0;
  dVar3 = *(double *)&this->field_0xa8;
  dVar4 = *(double *)&this->field_0xb0;
  dVar5 = *(double *)&this->field_0xb8;
  dVar6 = *(double *)&this->field_0xc0;
  dVar7 = *(double *)&this->field_0xc8;
  dVar8 = *(double *)&this->field_0xd0;
  ChVariables::Get_qb((ChVectorRef *)&local_60,(ChVariables *)&this->variables);
  local_98 = local_60;
  dStack_90 = 1.48219693752374e-323;
  local_78 = 0;
  local_68 = local_58;
  if (2 < local_58) {
    puVar1 = &(this->super_ChNodeFEAbase).field_0x18;
    local_80 = (ChVectorRef *)&local_60;
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_48,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_98,(type *)0x0);
    (**(code **)(*(long *)puVar1 + 0x38))(puVar1,&local_48);
    ChVariables::Get_qb((ChVectorRef *)&local_60,(ChVariables *)&this->variables);
    local_98 = (double)((long)local_60 + 0x18);
    dStack_90 = 1.48219693752374e-323;
    local_78 = 3;
    local_68 = local_58;
    if (5 < local_58) {
      local_80 = (ChVectorRef *)&local_60;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_98,(type *)0x0);
      (**(code **)(*(long *)puVar1 + 0x48))(puVar1,&local_48);
      if ((step != 0.0) || (NAN(step))) {
        dVar9 = 1.0 / step;
        local_98 = dVar9 * (*(double *)&this->field_0xa0 - dVar2);
        dStack_90 = dVar9 * (*(double *)&this->field_0xa8 - dVar3);
        local_88 = dVar9 * (*(double *)&this->field_0xb0 - dVar4);
        (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x60))(puVar1,&local_98);
        local_98 = dVar9 * (*(double *)&this->field_0xb8 - dVar5);
        dStack_90 = dVar9 * (*(double *)&this->field_0xc0 - dVar6);
        local_88 = dVar9 * (*(double *)&this->field_0xc8 - dVar7);
        local_80 = (ChVectorRef *)(dVar9 * (*(double *)&this->field_0xd0 - dVar8));
        (**(code **)(*(long *)&(this->super_ChNodeFEAbase).field_0x18 + 0x68))(puVar1,&local_98);
      }
      return;
    }
  }
  dStack_90 = 1.48219693752374e-323;
  local_80 = (ChVectorRef *)&local_60;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    // ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}